

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O1

Expression * __thiscall soul::StructuralParser::parseParenthesisedExpression(StructuralParser *this)

{
  bool bVar1;
  Expression *pEVar2;
  PoolItem *pPVar3;
  DestructorFn *pDVar4;
  Context *c;
  CompileMessage local_68;
  
  pEVar2 = parseExpression(this,false);
  bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
          ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x2acfd0);
  if (bVar1) {
    pEVar2 = parseSuffixes(this,pEVar2);
    return pEVar2;
  }
  bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
          ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x289d49);
  if (bVar1) {
    c = &(pEVar2->super_Statement).super_ASTObject.context;
    pPVar3 = PoolAllocator::allocateSpaceForObject(&this->allocator->pool,0x68);
    AST::CommaSeparatedList::CommaSeparatedList((CommaSeparatedList *)&pPVar3->item,c);
    pPVar3->destructor =
         PoolAllocator::allocate<soul::AST::CommaSeparatedList,_soul::AST::Context_&>::
         anon_class_1_0_00000001::__invoke;
    ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL>::reserve
              ((ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL> *)(pPVar3 + 2),
               (size_t)(pPVar3[2].destructor + 1));
    pDVar4 = pPVar3[2].destructor;
    *(Expression **)(pPVar3[2].size + (long)pDVar4 * 8) = pEVar2;
    pPVar3[2].destructor = pDVar4 + 1;
    do {
      pEVar2 = parseExpression(this,false);
      ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL>::reserve
                ((ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL> *)(pPVar3 + 2),
                 (size_t)(pPVar3[2].destructor + 1));
      pDVar4 = pPVar3[2].destructor;
      *(Expression **)(pPVar3[2].size + (long)pDVar4 * 8) = pEVar2;
      pDVar4 = pDVar4 + 1;
      pPVar3[2].destructor = pDVar4;
      if ((DestructorFn *)0x10000 < pDVar4) {
        CompileMessageHelpers::createMessage<>
                  (&local_68,syntax,error,"Initialiser list exceeds max length limit");
        AST::Context::throwError(c,&local_68,false);
      }
      bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
              ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x289d49);
    } while (bVar1);
    Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
    ::expect<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x2acfd0);
    pEVar2 = (Expression *)&pPVar3->item;
  }
  else {
    Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
    ::expect<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x2acfd0);
  }
  return pEVar2;
}

Assistant:

AST::Expression& parseParenthesisedExpression()
    {
        auto& e = parseExpression();

        if (matchIf (Operator::closeParen))
            return parseSuffixes (e);

        if (matchIf (Operator::comma))
        {
            auto& list = allocate<AST::CommaSeparatedList> (e.context);
            list.items.push_back (e);

            for (;;)
            {
                list.items.push_back (parseExpression());

                if (list.items.size() > AST::maxInitialiserListLength)
                    e.context.throwError (Errors::tooManyInitialisers());

                if (matchIf (Operator::comma))
                    continue;

                expect (Operator::closeParen);
                break;
            }

            return list;
        }

        expect (Operator::closeParen);
        return e;
    }